

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O2

void __thiscall
Potassco::SmodelsConvert::SmData::addMinimize(SmData *this,Weight_t prio,WeightLitSpan *lits)

{
  int iVar1;
  mapped_type *this_00;
  WeightLit_t *pWVar2;
  WeightLit_t *pWVar3;
  WeightLit_t x;
  WeightLit_t local_30;
  Weight_t local_24;
  
  local_24 = prio;
  this_00 = std::
            map<int,_std::vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>_>_>_>
            ::operator[](&this->minimize_,&local_24);
  std::vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>::reserve
            (this_00,((long)(this_00->
                            super__Vector_base<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this_00->
                            super__Vector_base<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 3) + lits->size);
  pWVar2 = lits->first;
  for (pWVar3 = pWVar2; pWVar3 != pWVar2 + lits->size; pWVar3 = pWVar3 + 1) {
    local_30 = *pWVar3;
    if ((long)local_30 < 0) {
      iVar1 = local_30.lit;
      local_30.weight = -local_30.weight;
      local_30.lit = -iVar1;
    }
    std::vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>::push_back
              (this_00,&local_30);
    pWVar2 = lits->first;
  }
  return;
}

Assistant:

void addMinimize(Weight_t prio, const WeightLitSpan& lits) {
		WLitVec& body = minimize_[prio];
		body.reserve(body.size() + size(lits));
		for (const WeightLit_t* it = begin(lits); it != end(lits); ++it) {
			WeightLit_t x = *it;
			if (weight(x) < 0) {
				x.lit = -x.lit;
				x.weight = -x.weight;
			}
			body.push_back(x);
		}
	}